

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddFind.c
# Opt level: O0

DdNode * addDoIthBit(DdManager *dd,DdNode *f,DdNode *index)

{
  DdHalfWord index_00;
  DdNode *f_00;
  DdManager *T_00;
  DdManager *E_00;
  DdManager *local_70;
  DdManager *local_68;
  int v;
  int value;
  int mask;
  DdNode *fvn;
  DdNode *fv;
  DdNode *E;
  DdNode *T;
  DdNode *res;
  DdNode *index_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    if (((int)(f->type).value & 1 << ((byte)(int)(index->type).value & 0x1f)) == 0) {
      local_68 = (DdManager *)dd->zero;
    }
    else {
      local_68 = (DdManager *)dd->one;
    }
    dd_local = local_68;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,addDoIthBit,f,index);
    if (dd_local == (DdManager *)0x0) {
      index_00 = f->index;
      f_00 = (f->type).kids.E;
      T_00 = (DdManager *)addDoIthBit(dd,(f->type).kids.T,index);
      if (T_00 == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        E_00 = (DdManager *)addDoIthBit(dd,f_00,index);
        if (E_00 == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
          local_70 = T_00;
          if (T_00 != E_00) {
            local_70 = (DdManager *)cuddUniqueInter(dd,index_00,(DdNode *)T_00,(DdNode *)E_00);
          }
          if (local_70 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)T_00);
            Cudd_RecursiveDeref(dd,(DdNode *)E_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert2(dd,addDoIthBit,f,index,&local_70->sentinel);
            dd_local = local_70;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addDoIthBit(
  DdManager * dd,
  DdNode * f,
  DdNode * index)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int mask, value;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        mask = 1 << ((int) cuddV(index));
        value = (int) cuddV(f);
        return((value & mask) == 0 ? DD_ZERO(dd) : DD_ONE(dd));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addDoIthBit,f,index);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addDoIthBit(dd,fv,index);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addDoIthBit(dd,fvn,index);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addDoIthBit,f,index,res);

    return(res);

}